

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

void cleanup_chest_trap(void)

{
  chest_trap *pcVar1;
  chest_trap *old;
  chest_trap *trap;
  
  old = chest_traps;
  while (old != (chest_trap *)0x0) {
    string_free(old->name);
    string_free(old->code);
    string_free(old->msg);
    string_free(old->msg_death);
    free_effect(old->effect);
    pcVar1 = old->next;
    mem_free(old);
    old = pcVar1;
  }
  return;
}

Assistant:

static void cleanup_chest_trap(void)
{
	struct chest_trap *trap = chest_traps;
	while (trap) {
		struct chest_trap *old = trap;
		string_free(trap->name);
		string_free(trap->code);
		string_free(trap->msg);
		string_free(trap->msg_death);
		free_effect(trap->effect);
		trap = trap->next;
		mem_free(old);
	}
}